

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::
cni_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&),std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&)>
::_call<0,1,2,3>(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
                 *this,vector *args,sequence<0,_1,_2,_3> *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  numeric *__args_2;
  numeric *__args_1;
  reference val;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  var *in_stack_000000a0;
  var *in_stack_000000b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  pbVar1 = try_convert_and_check<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
           ::convert(in_stack_000000b0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,1);
  __args_2 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::
             convert(in_stack_000000b0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,2);
  __args_1 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_2UL>::
             convert(in_stack_000000a0);
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,3);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_3UL>::convert(val)
  ;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
  ::operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
                *)this_00,in_RDI,__args_1,__args_2,(any *)pbVar1);
  pbVar1 = type_convertor<std::__cxx11::string,std::__cxx11::string>::convert<std::__cxx11::string>
                     (&local_40);
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return this_00;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}